

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O2

vector<field::GF2E,_std::allocator<field::GF2E>_> *
anon_unknown.dwarf_39dbd::phase_1_expand
          (vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
          limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *h_1,
          uint nbChallenges)

{
  uint8_t *data;
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lambda_sized_buffer;
  hash_context ctx;
  allocator_type local_159;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  hash_context local_140;
  
  hash_init(&local_140,(ulong)instance->digest_size);
  data = (h_1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  hash_update(&local_140,data,
              (long)(h_1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)data);
  hash_final(&local_140);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
            (__return_storage_ptr__,(ulong)nbChallenges,(allocator_type *)&local_158);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_158,
             (ulong)instance->lambda,&local_159);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::reserve
            (__return_storage_ptr__,(ulong)instance->num_rounds);
  for (lVar1 = 0; (ulong)nbChallenges << 3 != lVar1; lVar1 = lVar1 + 8) {
    hash_squeeze(&local_140,local_158._M_impl.super__Vector_impl_data._M_start,
                 (long)local_158._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_158._M_impl.super__Vector_impl_data._M_start);
    field::GF2E::from_bytes
              ((GF2E *)((long)&((__return_storage_ptr__->
                                super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                _M_impl.super__Vector_impl_data._M_start)->data + lVar1),
               local_158._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_158);
  return __return_storage_ptr__;
}

Assistant:

std::vector<field::GF2E> phase_1_expand(const limbo_instance_t &instance,
                                        const std::vector<uint8_t> &h_1,
                                        unsigned int nbChallenges) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, h_1.data(), h_1.size());
  hash_final(&ctx);

  std::vector<field::GF2E> r_ejs(nbChallenges);
  std::vector<uint8_t> lambda_sized_buffer(instance.lambda);
  r_ejs.reserve(instance.num_rounds);
  for (size_t e = 0; e < nbChallenges; e++) {
    hash_squeeze(&ctx, lambda_sized_buffer.data(), lambda_sized_buffer.size());
    r_ejs[e].from_bytes(lambda_sized_buffer.data());
  }
  return r_ejs;
}